

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

bool __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::ends_with
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> *v)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10.size_ = v->size_;
  if (this->size_ < local_10.size_) {
    return false;
  }
  local_10.data_ = v->data_;
  iVar1 = compare(this,this->size_ - local_10.size_,0xffffffffffffffff,&local_10);
  return iVar1 == 0;
}

Assistant:

nssv_constexpr bool ends_with( basic_string_view v ) const nssv_noexcept  // (1)
    {
        return size() >= v.size() && compare( size() - v.size(), npos, v ) == 0;
    }